

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall SerialExecutionQueue::cancelAllJobs(SerialExecutionQueue *this)

{
  int iVar1;
  thread *this_00;
  pthread_mutex_t *__mutex;
  SerialExecutionQueue *local_40;
  code *local_38;
  undefined8 local_30;
  
  __mutex = (pthread_mutex_t *)&(this->spawnedProcesses).mutex;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if (((this->cancelled)._M_base._M_i & 1U) == 0) {
      LOCK();
      (this->cancelled)._M_base._M_i = true;
      UNLOCK();
      (this->spawnedProcesses).closed = true;
      pthread_mutex_unlock(__mutex);
      llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,2);
      __mutex = (pthread_mutex_t *)&this->killAfterTimeoutThreadMutex;
      iVar1 = pthread_mutex_lock(__mutex);
      if (iVar1 != 0) goto LAB_001c8700;
      local_38 = killAfterTimeout;
      local_30 = 0;
      local_40 = this;
      this_00 = (thread *)operator_new(8);
      std::thread::thread<void(SerialExecutionQueue::*)(),SerialExecutionQueue*,void>
                (this_00,(offset_in_SerialExecutionQueue_to_subr *)&local_38,&local_40);
      std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                 &this->killAfterTimeoutThread,this_00);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
LAB_001c8700:
  std::__throw_system_error(iVar1);
}

Assistant:

virtual void cancelAllJobs() override {
    {
      std::lock_guard<std::mutex> guard(spawnedProcesses.mutex);
      if (cancelled) return;
      cancelled = true;
      spawnedProcesses.close();
    }

    spawnedProcesses.signalAll(SIGINT);
    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      killAfterTimeoutThread = llvm::make_unique<std::thread>(
          &SerialExecutionQueue::killAfterTimeout, this);
    }
  }